

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall Js::RecyclableTypedArrayWalker::GetChildrenCount(RecyclableTypedArrayWalker *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  TypedArrayBase *this_00;
  uint32 local_28;
  TypedArrayBase *typedArrayObj;
  RecyclableTypedArrayWalker *this_local;
  
  if ((this->super_RecyclableArrayWalker).indexedItemCount == 0) {
    bVar2 = VarIs<Js::TypedArrayBase>
                      ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xcc6,"(Js::VarIs<Js::TypedArrayBase>(instance))",
                                  "Js::VarIs<Js::TypedArrayBase>(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = VarTo<Js::TypedArrayBase>
                        ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    uVar3 = ArrayObject::GetLength((ArrayObject *)this_00);
    if (((this->super_RecyclableArrayWalker).fOnlyOwnProperties & 1U) == 0) {
      local_28 = RecyclableObjectWalker::GetChildrenCount((RecyclableObjectWalker *)this);
    }
    else {
      local_28 = 0;
    }
    (this->super_RecyclableArrayWalker).indexedItemCount = uVar3 + local_28;
  }
  return (this->super_RecyclableArrayWalker).indexedItemCount;
}

Assistant:

uint32 RecyclableTypedArrayWalker::GetChildrenCount()
    {
        if (!indexedItemCount)
        {
            Assert(Js::VarIs<Js::TypedArrayBase>(instance));

            Js::TypedArrayBase * typedArrayObj = Js::VarTo<Js::TypedArrayBase>(instance);

            indexedItemCount = typedArrayObj->GetLength() + (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);
        }

        return indexedItemCount;
    }